

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall
Rml::ElementDocument::ProcessHeader(ElementDocument *this,DocumentHeader *document_header)

{
  bool bVar1;
  Template *pTVar2;
  reference _url;
  String *name;
  DocumentHeader *header_00;
  undefined8 uVar3;
  pointer *this_00;
  pointer pSVar4;
  element_type *peVar5;
  element_type *other;
  pointer *this_01;
  reference pRVar6;
  float local_4f8;
  Vector2i local_47c;
  Vector2f local_474;
  Vector2f vp_dimensions;
  float dp_ratio;
  Resource *script;
  iterator __end1_1;
  iterator __begin1_1;
  ResourceList *__range1_1;
  StyleSheetContainer local_3e8;
  undefined1 local_3a0 [24];
  StyleSheetContainer *sub_sheet;
  undefined8 local_250;
  unsigned_long local_248;
  unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> local_240;
  UniquePtr<Rml::StreamMemory> stream;
  SharedPtr<Rml::StyleSheetContainer> inline_sheet;
  Resource *rcss;
  iterator __end1;
  iterator __begin1;
  ResourceList *__range1;
  SharedPtr<StyleSheetContainer> new_style_sheet;
  Template *merge_template;
  size_t i;
  undefined1 local_a0 [8];
  DocumentHeader header;
  DocumentHeader *document_header_local;
  ElementDocument *this_local;
  
  header.scripts.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)document_header;
  ::std::__cxx11::string::operator=((string *)&this->source_url,(string *)document_header);
  DocumentHeader::DocumentHeader((DocumentHeader *)local_a0);
  DocumentHeader::MergePaths
            ((DocumentHeader *)local_a0,(StringList *)((long)&header.title.field_2 + 8),
             (StringList *)
             &(header.scripts.
               super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->is_inline,
             &(header.scripts.
               super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->path);
  for (merge_template = (Template *)0x0;
      pTVar2 = (Template *)
               ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(header.title.field_2._M_local_buf + 8)), merge_template < pTVar2;
      merge_template = (Template *)&(merge_template->name).field_0x1) {
    _url = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(header.title.field_2._M_local_buf + 8),(size_type)merge_template);
    URL::URL((URL *)&new_style_sheet.
                     super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,_url);
    name = URL::GetURL_abi_cxx11_
                     ((URL *)&new_style_sheet.
                              super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    pTVar2 = TemplateCache::LoadTemplate(name);
    URL::~URL((URL *)&new_style_sheet.
                      super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
    if (pTVar2 == (Template *)0x0) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(header.title.field_2._M_local_buf + 8),(size_type)merge_template);
      uVar3 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,"Template %s not found",uVar3);
    }
    else {
      header_00 = Template::GetHeader(pTVar2);
      DocumentHeader::MergeHeader((DocumentHeader *)local_a0,header_00);
    }
  }
  DocumentHeader::MergeHeader
            ((DocumentHeader *)local_a0,
             (DocumentHeader *)
             header.scripts.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::__cxx11::string::operator=
            ((string *)&this->title,
             (string *)
             &(header.scripts.
               super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->content);
  ::std::shared_ptr<Rml::StyleSheetContainer>::shared_ptr
            ((shared_ptr<Rml::StyleSheetContainer> *)&__range1);
  this_00 = &header.template_resources.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = ::std::
           vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
           begin((vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
                  *)this_00);
  rcss = (Resource *)
         ::std::
         vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::end
                   ((vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
                     *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Rml::DocumentHeader::Resource_*,_std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>_>
                                     *)&rcss), bVar1) {
    pRVar6 = __gnu_cxx::
             __normal_iterator<Rml::DocumentHeader::Resource_*,_std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>_>
             ::operator*(&__end1);
    if ((pRVar6->is_inline & 1U) == 0) {
      local_3a0._16_8_ = StyleSheetFactory::GetStyleSheetContainer(&pRVar6->path);
      if ((StyleSheetContainer *)local_3a0._16_8_ == (StyleSheetContainer *)0x0) {
        uVar3 = ::std::__cxx11::string::c_str();
        Log::Message(LT_ERROR,"Failed to load style sheet %s.",uVar3);
      }
      else {
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range1);
        uVar3 = local_3a0._16_8_;
        if (bVar1) {
          peVar5 = ::std::
                   __shared_ptr_access<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&__range1);
          StyleSheetContainer::MergeStyleSheetContainer
                    (peVar5,(StyleSheetContainer *)local_3a0._16_8_);
        }
        else {
          StyleSheetContainer::StyleSheetContainer(&local_3e8);
          StyleSheetContainer::CombineStyleSheetContainer
                    ((StyleSheetContainer *)local_3a0,(StyleSheetContainer *)uVar3);
          ::std::shared_ptr<Rml::StyleSheetContainer>::operator=
                    ((shared_ptr<Rml::StyleSheetContainer> *)&__range1,
                     (shared_ptr<Rml::StyleSheetContainer> *)local_3a0);
          ::std::shared_ptr<Rml::StyleSheetContainer>::~shared_ptr
                    ((shared_ptr<Rml::StyleSheetContainer> *)local_3a0);
          StyleSheetContainer::~StyleSheetContainer(&local_3e8);
        }
      }
    }
    else {
      MakeShared<Rml::StyleSheetContainer>();
      local_248 = ::std::__cxx11::string::c_str();
      local_250 = ::std::__cxx11::string::size();
      MakeUnique<Rml::StreamMemory,unsigned_char_const*,unsigned_long>
                ((uchar **)&local_240,&local_248);
      pSVar4 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
               operator->(&local_240);
      URL::URL((URL *)&sub_sheet,&pRVar6->path);
      StreamMemory::SetSourceURL(pSVar4,(URL *)&sub_sheet);
      URL::~URL((URL *)&sub_sheet);
      peVar5 = ::std::
               __shared_ptr_access<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stream);
      pSVar4 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::get
                         (&local_240);
      bVar1 = StyleSheetContainer::LoadStyleSheetContainer
                        (peVar5,&pSVar4->super_Stream,pRVar6->line);
      if (bVar1) {
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range1);
        if (bVar1) {
          peVar5 = ::std::
                   __shared_ptr_access<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&__range1);
          other = ::std::
                  __shared_ptr_access<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&stream);
          StyleSheetContainer::MergeStyleSheetContainer(peVar5,other);
        }
        else {
          ::std::shared_ptr<Rml::StyleSheetContainer>::operator=
                    ((shared_ptr<Rml::StyleSheetContainer> *)&__range1,
                     (shared_ptr<Rml::StyleSheetContainer> *)&stream);
        }
      }
      ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::reset
                (&local_240,(pointer)0x0);
      ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
                (&local_240);
      ::std::shared_ptr<Rml::StyleSheetContainer>::~shared_ptr
                ((shared_ptr<Rml::StyleSheetContainer> *)&stream);
    }
    __gnu_cxx::
    __normal_iterator<Rml::DocumentHeader::Resource_*,_std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>_>
    ::operator++(&__end1);
  }
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range1);
  if (bVar1) {
    ::std::shared_ptr<Rml::StyleSheetContainer>::shared_ptr
              ((shared_ptr<Rml::StyleSheetContainer> *)&__range1_1,
               (shared_ptr<Rml::StyleSheetContainer> *)&__range1);
    SetStyleSheetContainer(this,(shared_ptr<Rml::StyleSheetContainer> *)&__range1_1);
    ::std::shared_ptr<Rml::StyleSheetContainer>::~shared_ptr
              ((shared_ptr<Rml::StyleSheetContainer> *)&__range1_1);
  }
  this_01 = &header.rcss.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_1 = ::std::
             vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
             begin((vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
                    *)this_01);
  script = (Resource *)
           ::std::
           vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>::
           end((vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
                *)this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Rml::DocumentHeader::Resource_*,_std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>_>
                             *)&script), bVar1) {
    pRVar6 = __gnu_cxx::
             __normal_iterator<Rml::DocumentHeader::Resource_*,_std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>_>
             ::operator*(&__end1_1);
    if ((pRVar6->is_inline & 1U) == 0) {
      (*(this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x19])
                (this,pRVar6);
    }
    else {
      (*(this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x18])
                (this,&pRVar6->content,pRVar6,(ulong)(uint)pRVar6->line);
    }
    __gnu_cxx::
    __normal_iterator<Rml::DocumentHeader::Resource_*,_std::vector<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>_>
    ::operator++(&__end1_1);
  }
  Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>
            ((Property *)&vp_dimensions.y,Hidden);
  Element::SetProperty(&this->super_Element,Visibility,(Property *)&vp_dimensions.y);
  Property::~Property((Property *)&vp_dimensions.y);
  if (this->context == (Context *)0x0) {
    local_4f8 = 1.0;
  }
  else {
    local_4f8 = Context::GetDensityIndependentPixelRatio(this->context);
  }
  vp_dimensions.x = local_4f8;
  if (this->context == (Context *)0x0) {
    Vector2<float>::Vector2(&local_474,1.0);
  }
  else {
    local_47c = Context::GetDimensions(this->context);
    local_474 = Vector2::operator_cast_to_Vector2((Vector2 *)&local_47c);
  }
  Element::UpdateProperties(&this->super_Element,vp_dimensions.x,local_474);
  ::std::shared_ptr<Rml::StyleSheetContainer>::~shared_ptr
            ((shared_ptr<Rml::StyleSheetContainer> *)&__range1);
  DocumentHeader::~DocumentHeader((DocumentHeader *)local_a0);
  return;
}

Assistant:

void ElementDocument::ProcessHeader(const DocumentHeader* document_header)
{
	RMLUI_ZoneScoped;

	// Store the source address that we came from
	source_url = document_header->source;

	// Construct a new header and copy the template details across
	DocumentHeader header;
	header.MergePaths(header.template_resources, document_header->template_resources, document_header->source);

	// Merge in any templates, note a merge may cause more templates to merge
	for (size_t i = 0; i < header.template_resources.size(); i++)
	{
		Template* merge_template = TemplateCache::LoadTemplate(URL(header.template_resources[i]).GetURL());

		if (merge_template)
			header.MergeHeader(*merge_template->GetHeader());
		else
			Log::Message(Log::LT_WARNING, "Template %s not found", header.template_resources[i].c_str());
	}

	// Merge the document's header last, as it is the most overriding.
	header.MergeHeader(*document_header);

	// Set the title to the document title.
	title = document_header->title;

	// If a style-sheet (or sheets) has been specified for this element, then we load them and set the combined sheet
	// on the element; all of its children will inherit it by default.
	SharedPtr<StyleSheetContainer> new_style_sheet;

	// Combine any inline sheets.
	for (const DocumentHeader::Resource& rcss : header.rcss)
	{
		if (rcss.is_inline)
		{
			auto inline_sheet = MakeShared<StyleSheetContainer>();
			auto stream = MakeUnique<StreamMemory>((const byte*)rcss.content.c_str(), rcss.content.size());
			stream->SetSourceURL(rcss.path);

			if (inline_sheet->LoadStyleSheetContainer(stream.get(), rcss.line))
			{
				if (new_style_sheet)
					new_style_sheet->MergeStyleSheetContainer(*inline_sheet);
				else
					new_style_sheet = std::move(inline_sheet);
			}

			stream.reset();
		}
		else
		{
			const StyleSheetContainer* sub_sheet = StyleSheetFactory::GetStyleSheetContainer(rcss.path);
			if (sub_sheet)
			{
				if (new_style_sheet)
					new_style_sheet->MergeStyleSheetContainer(*sub_sheet);
				else
					new_style_sheet = sub_sheet->CombineStyleSheetContainer(StyleSheetContainer());
			}
			else
				Log::Message(Log::LT_ERROR, "Failed to load style sheet %s.", rcss.path.c_str());
		}
	}

	// If a style sheet is available, set it on the document.
	if (new_style_sheet)
		SetStyleSheetContainer(std::move(new_style_sheet));

	// Load scripts.
	for (const DocumentHeader::Resource& script : header.scripts)
	{
		if (script.is_inline)
		{
			LoadInlineScript(script.content, script.path, script.line);
		}
		else
		{
			LoadExternalScript(script.path);
		}
	}

	// Hide this document.
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));

	const float dp_ratio = (context ? context->GetDensityIndependentPixelRatio() : 1.0f);
	const Vector2f vp_dimensions = (context ? Vector2f(context->GetDimensions()) : Vector2f(1.0f));

	// Update properties so that e.g. visibility status can be queried properly immediately.
	UpdateProperties(dp_ratio, vp_dimensions);
}